

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_std_urlGet(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint8_t *puVar1;
  uint8_t c;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  char *__s;
  JSRuntime *pJVar6;
  size_t sVar7;
  FILE *__stream;
  uint8_t *data;
  undefined4 extraout_var;
  size_t len;
  ulong uVar8;
  uint8_t *puVar9;
  size_t sVar10;
  uint8_t *puVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue val;
  BOOL full_flag;
  BOOL binary_flag;
  DynBuf header_buf_s;
  DynBuf data_buf_s;
  DynBuf cmd_buf;
  BOOL local_e0;
  BOOL local_dc;
  FILE *local_d8;
  undefined8 local_d0;
  ulong local_c8;
  DynBuf local_c0;
  DynBuf local_90;
  DynBuf local_60;
  
  __s = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  JVar13 = (JSValue)(ZEXT816(6) << 0x40);
  if (__s == (char *)0x0) {
    uVar8 = 0;
    goto LAB_00110ab6;
  }
  local_dc = 0;
  local_e0 = 0;
  if (argc < 2) {
LAB_001109e7:
    pJVar6 = JS_GetRuntime(ctx);
    dbuf_init2(&local_60,pJVar6,js_realloc_rt);
    dbuf_printf(&local_60,"%s \'\'","curl -s -i");
    sVar7 = strlen(__s);
    if (sVar7 != 0) {
      sVar10 = 0;
      do {
        c = __s[sVar10];
        if ((c == '\\') || (c == '\'')) {
          dbuf_putc(&local_60,'\\');
        }
        dbuf_putc(&local_60,c);
        sVar10 = sVar10 + 1;
      } while (sVar7 != sVar10);
    }
    JS_FreeCString(ctx,__s);
    dbuf_putstr(&local_60,"\'\'");
    dbuf_putc(&local_60,'\0');
    if (local_60.error == 0) {
      __stream = popen((char *)local_60.buf,"r");
      dbuf_free(&local_60);
      if (__stream == (FILE *)0x0) {
        JVar13 = JS_ThrowTypeError(ctx,"could not start curl");
        uVar8 = (ulong)JVar13.u.ptr & 0xffffffff00000000;
        goto LAB_00110ab6;
      }
      pJVar6 = JS_GetRuntime(ctx);
      dbuf_init2(&local_90,pJVar6,js_realloc_rt);
      pJVar6 = JS_GetRuntime(ctx);
      dbuf_init2(&local_c0,pJVar6,js_realloc_rt);
      data = (uint8_t *)js_malloc(ctx,0x1000);
      local_c8 = 3;
      puVar11 = data;
      if (data != (uint8_t *)0x0) {
        do {
          iVar4 = fgetc(__stream);
          if (iVar4 < 0) {
            local_d0 = 0;
            JVar14 = (JSValue)(ZEXT816(2) << 0x40);
            goto LAB_00110cb2;
          }
          if ((ulong)((long)puVar11 - (long)data) < 0xfff) {
            *puVar11 = (uint8_t)iVar4;
            puVar11 = puVar11 + 1;
          }
        } while (iVar4 != 10);
        *puVar11 = '\0';
        for (puVar9 = data; *puVar9 != '\0'; puVar9 = puVar9 + 1) {
          if (*puVar9 == ' ') goto LAB_00110ba0;
        }
        local_d0 = 0;
        goto LAB_00110c13;
      }
      puVar11 = (uint8_t *)0x0;
      JVar14 = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_00110bdc;
    }
    dbuf_free(&local_60);
  }
  else {
    JVar13 = argv[1];
    iVar4 = get_bool_option(ctx,&local_dc,argv[1],"binary");
    if ((iVar4 == 0) && (iVar4 = get_bool_option(ctx,&local_e0,JVar13,"full"), iVar4 == 0))
    goto LAB_001109e7;
    JS_FreeCString(ctx,__s);
  }
  goto LAB_00110aac;
LAB_00110ba0:
  do {
    puVar1 = puVar9 + 1;
    puVar9 = puVar9 + 1;
  } while (*puVar1 == ' ');
  iVar4 = atoi((char *)puVar9);
  local_d0 = CONCAT44(extraout_var,iVar4);
LAB_00110c13:
  puVar9 = data;
  if ((local_e0 == 0) && (JVar14 = (JSValue)(ZEXT816(2) << 0x40), 99 < (int)local_d0 - 200U)) {
LAB_00110cb2:
    uVar8 = JVar14.tag;
    uVar5 = JVar14.u._0_4_;
    js_free(ctx,data);
    pclose(__stream);
    dbuf_free(&local_90);
    if (local_e0 == 0) {
      JVar13.tag = uVar8;
      JVar13.u.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | (long)puVar11 << 0x20);
    }
    else {
      JVar13 = JS_NewObject(ctx);
      if ((int)JVar13.tag == 6) {
        js_free(ctx,(void *)0x0);
        goto LAB_00110cf1;
      }
      val.u.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | (long)puVar11 << 0x20);
      val.tag = uVar8;
      JS_DefinePropertyValueStr(ctx,JVar13,"response",val,7);
      if ((int)JVar14.tag != 2) {
        JVar14 = JS_NewStringLen(ctx,(char *)local_c0.buf,local_c0.size);
        JS_DefinePropertyValueStr(ctx,JVar13,"responseHeaders",JVar14,7);
        JS_DefinePropertyValueStr(ctx,JVar13,"status",(JSValue)ZEXT416((uint)local_d0),7);
      }
    }
    dbuf_free(&local_c0);
    uVar8 = (ulong)JVar13.u.ptr & 0xffffffff00000000;
    goto LAB_00110ab6;
  }
  do {
    local_d8 = __stream;
    uVar5 = fgetc(local_d8);
    __stream = local_d8;
    JVar14 = (JSValue)(ZEXT816(2) << 0x40);
    if ((int)uVar5 < 0) goto LAB_00110cb2;
    puVar11 = (uint8_t *)(ulong)uVar5;
    if ((ulong)((long)puVar9 - (long)data) < 0xfff) {
      *puVar9 = (uint8_t)uVar5;
      puVar9 = puVar9 + 1;
    }
    dbuf_putc(&local_c0,(uint8_t)uVar5);
    __stream = local_d8;
  } while ((((uVar5 != 10) || (*puVar9 = '\0', puVar9 = data, *data != '\r')) || (data[1] != '\n'))
          || (data[2] != '\0'));
  puVar11 = (uint8_t *)0x0;
  if (local_c0.error == 0) {
    local_c0.size = local_c0.size - 2;
    len = fread(data,1,0x1000,local_d8);
    if (len != 0) {
      do {
        dbuf_put(&local_90,data,len);
        len = fread(data,1,0x1000,__stream);
      } while (len != 0);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_c8;
    JVar14 = (JSValue)(auVar3 << 0x40);
    if (local_90.error == 0) {
      if (local_dc == 0) {
        JVar14 = JS_NewStringLen(ctx,(char *)local_90.buf,local_90.size);
      }
      else {
        JVar14 = JS_NewArrayBufferCopy(ctx,local_90.buf,local_90.size);
      }
      local_c8 = JVar14.tag;
      puVar11 = (uint8_t *)((ulong)JVar14.u.ptr >> 0x20);
      if ((int)JVar14.tag != 6) goto LAB_00110cb2;
    }
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_c8;
    JVar14 = (JSValue)(auVar2 << 0x40);
  }
LAB_00110bdc:
  local_c8 = JVar14.tag;
  uVar5 = JVar14.u._0_4_;
  pclose(__stream);
  js_free(ctx,data);
  dbuf_free(&local_90);
  uVar8 = local_c8;
LAB_00110cf1:
  dbuf_free(&local_c0);
  if (0xfffffff4 < (uint)uVar8) {
    JVar14.u.ptr = (void *)((ulong)uVar5 | (long)puVar11 << 0x20);
    iVar4 = *JVar14.u.ptr;
    *(int *)JVar14.u.ptr = iVar4 + -1;
    if (iVar4 < 2) {
      JVar14.tag = uVar8;
      __JS_FreeValue(ctx,JVar14);
    }
  }
LAB_00110aac:
  uVar8 = 0;
  JVar13 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00110ab6:
  JVar12.tag = JVar13.tag;
  JVar12.u.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | uVar8);
  return JVar12;
}

Assistant:

static JSValue js_std_urlGet(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *url;
    DynBuf cmd_buf;
    DynBuf data_buf_s, *data_buf = &data_buf_s;
    DynBuf header_buf_s, *header_buf = &header_buf_s;
    char *buf; 
    size_t i, len;
    int c, status;
    JSValue response = JS_UNDEFINED, ret_obj;
    JSValueConst options_obj;
    FILE *f;
    BOOL binary_flag, full_flag;
    
    url = JS_ToCString(ctx, argv[0]);
    if (!url)
        return JS_EXCEPTION;
    
    binary_flag = FALSE;
    full_flag = FALSE;
    
    if (argc >= 2) {
        options_obj = argv[1];

        if (get_bool_option(ctx, &binary_flag, options_obj, "binary"))
            goto fail_obj;

        if (get_bool_option(ctx, &full_flag, options_obj, "full")) {
        fail_obj:
            JS_FreeCString(ctx, url);
            return JS_EXCEPTION;
        }
    }
    
    js_std_dbuf_init(ctx, &cmd_buf);
    dbuf_printf(&cmd_buf, "%s ''", URL_GET_PROGRAM);
    len = strlen(url);
    for(i = 0; i < len; i++) {
        c = url[i];
        if (c == '\'' || c == '\\')
            dbuf_putc(&cmd_buf, '\\');
        dbuf_putc(&cmd_buf, c);
    }
    JS_FreeCString(ctx, url);
    dbuf_putstr(&cmd_buf, "''");
    dbuf_putc(&cmd_buf, '\0');
    if (dbuf_error(&cmd_buf)) {
        dbuf_free(&cmd_buf);
        return JS_EXCEPTION;
    }
    //    printf("%s\n", (char *)cmd_buf.buf);
    f = popen((char *)cmd_buf.buf, "r");
    dbuf_free(&cmd_buf);
    if (!f) {
        return JS_ThrowTypeError(ctx, "could not start curl");
    }

    js_std_dbuf_init(ctx, data_buf);
    js_std_dbuf_init(ctx, header_buf);
    
    buf = js_malloc(ctx, URL_GET_BUF_SIZE);
    if (!buf)
        goto fail;

    /* get the HTTP status */
    if (http_get_header_line(f, buf, URL_GET_BUF_SIZE, NULL) < 0) {
        status = 0;
        goto bad_header;
    }
    status = http_get_status(buf);
    if (!full_flag && !(status >= 200 && status <= 299)) {
        goto bad_header;
    }
    
    /* wait until there is an empty line */
    for(;;) {
        if (http_get_header_line(f, buf, URL_GET_BUF_SIZE, header_buf) < 0) {
        bad_header:
            response = JS_NULL;
            goto done;
        }
        if (!strcmp(buf, "\r\n"))
            break;
    }
    if (dbuf_error(header_buf))
        goto fail;
    header_buf->size -= 2; /* remove the trailing CRLF */

    /* download the data */
    for(;;) {
        len = fread(buf, 1, URL_GET_BUF_SIZE, f);
        if (len == 0)
            break;
        dbuf_put(data_buf, (uint8_t *)buf, len);
    }
    if (dbuf_error(data_buf))
        goto fail;
    if (binary_flag) {
        response = JS_NewArrayBufferCopy(ctx,
                                         data_buf->buf, data_buf->size);
    } else {
        response = JS_NewStringLen(ctx, (char *)data_buf->buf, data_buf->size);
    }
    if (JS_IsException(response))
        goto fail;
 done:
    js_free(ctx, buf);
    buf = NULL;
    pclose(f);
    f = NULL;
    dbuf_free(data_buf);
    data_buf = NULL;

    if (full_flag) {
        ret_obj = JS_NewObject(ctx);
        if (JS_IsException(ret_obj))
            goto fail;
        JS_DefinePropertyValueStr(ctx, ret_obj, "response",
                                  response,
                                  JS_PROP_C_W_E);
        if (!JS_IsNull(response)) {
            JS_DefinePropertyValueStr(ctx, ret_obj, "responseHeaders",
                                      JS_NewStringLen(ctx, (char *)header_buf->buf,
                                                      header_buf->size),
                                      JS_PROP_C_W_E);
            JS_DefinePropertyValueStr(ctx, ret_obj, "status",
                                      JS_NewInt32(ctx, status),
                                      JS_PROP_C_W_E);
        }
    } else {
        ret_obj = response;
    }
    dbuf_free(header_buf);
    return ret_obj;
 fail:
    if (f)
        pclose(f);
    js_free(ctx, buf);
    if (data_buf)
        dbuf_free(data_buf);
    if (header_buf)
        dbuf_free(header_buf);
    JS_FreeValue(ctx, response);
    return JS_EXCEPTION;
}